

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O3

void __thiscall
helics::ActionMessage::ActionMessage
          (ActionMessage *this,action_t startingAction,GlobalFederateId sourceId,
          GlobalFederateId destId)

{
  SmallBuffer *pSVar1;
  
  this->messageAction = startingAction;
  this->messageID = 0;
  (this->source_id).gid = sourceId.gid;
  (this->source_handle).hid = -1700000000;
  (this->dest_id).gid = destId.gid;
  (this->dest_handle).hid = -1700000000;
  this->counter = 0;
  this->flags = 0;
  this->sequenceID = 0;
  (this->actionTime).internalTimeCode = 0;
  (this->Te).internalTimeCode = 0;
  (this->Tdemin).internalTimeCode = 0;
  (this->Tso).internalTimeCode = 0;
  (this->payload).buffer._M_elems[0] = 0;
  (this->payload).buffer._M_elems[1] = 0;
  (this->payload).buffer._M_elems[2] = 0;
  (this->payload).buffer._M_elems[3] = 0;
  (this->payload).buffer._M_elems[4] = 0;
  (this->payload).buffer._M_elems[5] = 0;
  (this->payload).buffer._M_elems[6] = 0;
  (this->payload).buffer._M_elems[7] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[8] = 0;
  (pSVar1->buffer)._M_elems[9] = 0;
  (pSVar1->buffer)._M_elems[10] = 0;
  (pSVar1->buffer)._M_elems[0xb] = 0;
  (pSVar1->buffer)._M_elems[0xc] = 0;
  (pSVar1->buffer)._M_elems[0xd] = 0;
  (pSVar1->buffer)._M_elems[0xe] = 0;
  (pSVar1->buffer)._M_elems[0xf] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x10] = 0;
  (pSVar1->buffer)._M_elems[0x11] = 0;
  (pSVar1->buffer)._M_elems[0x12] = 0;
  (pSVar1->buffer)._M_elems[0x13] = 0;
  (pSVar1->buffer)._M_elems[0x14] = 0;
  (pSVar1->buffer)._M_elems[0x15] = 0;
  (pSVar1->buffer)._M_elems[0x16] = 0;
  (pSVar1->buffer)._M_elems[0x17] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x18] = 0;
  (pSVar1->buffer)._M_elems[0x19] = 0;
  (pSVar1->buffer)._M_elems[0x1a] = 0;
  (pSVar1->buffer)._M_elems[0x1b] = 0;
  (pSVar1->buffer)._M_elems[0x1c] = 0;
  (pSVar1->buffer)._M_elems[0x1d] = 0;
  (pSVar1->buffer)._M_elems[0x1e] = 0;
  (pSVar1->buffer)._M_elems[0x1f] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x20] = 0;
  (pSVar1->buffer)._M_elems[0x21] = 0;
  (pSVar1->buffer)._M_elems[0x22] = 0;
  (pSVar1->buffer)._M_elems[0x23] = 0;
  (pSVar1->buffer)._M_elems[0x24] = 0;
  (pSVar1->buffer)._M_elems[0x25] = 0;
  (pSVar1->buffer)._M_elems[0x26] = 0;
  (pSVar1->buffer)._M_elems[0x27] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x28] = 0;
  (pSVar1->buffer)._M_elems[0x29] = 0;
  (pSVar1->buffer)._M_elems[0x2a] = 0;
  (pSVar1->buffer)._M_elems[0x2b] = 0;
  (pSVar1->buffer)._M_elems[0x2c] = 0;
  (pSVar1->buffer)._M_elems[0x2d] = 0;
  (pSVar1->buffer)._M_elems[0x2e] = 0;
  (pSVar1->buffer)._M_elems[0x2f] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x30] = 0;
  (pSVar1->buffer)._M_elems[0x31] = 0;
  (pSVar1->buffer)._M_elems[0x32] = 0;
  (pSVar1->buffer)._M_elems[0x33] = 0;
  (pSVar1->buffer)._M_elems[0x34] = 0;
  (pSVar1->buffer)._M_elems[0x35] = 0;
  (pSVar1->buffer)._M_elems[0x36] = 0;
  (pSVar1->buffer)._M_elems[0x37] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x38] = 0;
  (pSVar1->buffer)._M_elems[0x39] = 0;
  (pSVar1->buffer)._M_elems[0x3a] = 0;
  (pSVar1->buffer)._M_elems[0x3b] = 0;
  (pSVar1->buffer)._M_elems[0x3c] = 0;
  (pSVar1->buffer)._M_elems[0x3d] = 0;
  (pSVar1->buffer)._M_elems[0x3e] = 0;
  (pSVar1->buffer)._M_elems[0x3f] = 0;
  (this->payload).bufferSize = 0;
  (this->payload).bufferCapacity = 0x40;
  (this->payload).heap = (byte *)&this->payload;
  (this->payload).nonOwning = false;
  (this->payload).locked = false;
  (this->payload).usingAllocatedBuffer = false;
  (this->payload).errorCondition = '\0';
  (this->payload).userKey = 0;
  (this->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ActionMessage::ActionMessage(action_message_def::action_t startingAction,
                             GlobalFederateId sourceId,
                             GlobalFederateId destId):
    messageAction(startingAction), source_id(sourceId), dest_id(destId)
{
}